

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O1

int __thiscall H264StreamReader::calcPicOrder(H264StreamReader *this,SliceUnit *slice)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 *puVar6;
  uint uVar7;
  ostringstream ss;
  uint *local_1b0;
  undefined8 local_1a8;
  uint local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  ostringstream local_190 [376];
  
  if (slice->sps->pic_order_cnt_type != 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"SPS picture order ",0x12);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," not supported.",0xf);
    puVar6 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar6 = 0x12e;
    *(undefined4 **)(puVar6 + 2) = puVar6 + 6;
    if (local_1b0 == &local_1a0) {
      puVar6[6] = local_1a0;
      puVar6[7] = uStack_19c;
      puVar6[8] = uStack_198;
      puVar6[9] = uStack_194;
    }
    else {
      *(uint **)(puVar6 + 2) = local_1b0;
      *(ulong *)(puVar6 + 6) = CONCAT44(uStack_19c,local_1a0);
    }
    *(undefined8 *)(puVar6 + 4) = local_1a8;
    local_1a0 = local_1a0 & 0xffffff00;
    __cxa_throw(puVar6,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  bVar3 = SliceUnit::isIDR(slice);
  if (bVar3) {
    this->prevPicOrderCntMsb = 0;
    this->prevPicOrderCntLsb = 0;
  }
  iVar4 = 1 << ((byte)slice->sps->log2_max_pic_order_cnt_lsb & 0x1f);
  uVar1 = slice->pic_order_cnt_lsb;
  iVar2 = this->prevPicOrderCntLsb;
  if (((int)(uint)uVar1 < iVar2) && (iVar4 / 2 <= (int)(iVar2 - (uint)uVar1))) {
    iVar4 = iVar4 + this->prevPicOrderCntMsb;
  }
  else if ((iVar2 < (int)(uint)uVar1) && (iVar4 / 2 < (int)((uint)uVar1 - iVar2))) {
    iVar4 = this->prevPicOrderCntMsb - iVar4;
  }
  else {
    iVar4 = this->prevPicOrderCntMsb;
  }
  if (slice->memory_management_control_operation == 5) {
    this->prevPicOrderCntMsb = 0;
    uVar7 = iVar4 + (uint)uVar1;
    if (slice->bottom_field_flag != 0) {
      uVar7 = 0;
    }
  }
  else {
    this->prevPicOrderCntMsb = iVar4;
    uVar7 = (uint)uVar1;
  }
  this->prevPicOrderCntLsb = uVar7;
  return (int)(iVar4 + (uint)uVar1) >> ((byte)this->m_forceLsbDiv & 0x1f);
}

Assistant:

int H264StreamReader::calcPicOrder(const SliceUnit &slice)
{
    if (slice.getSPS()->pic_order_cnt_type != 0)
        THROW(ERR_H264_UNSUPPORTED_PARAMETER,
              "SPS picture order " << slice.getSPS()->pic_order_cnt_type << " not supported.")

    if (slice.isIDR())
        prevPicOrderCntMsb = prevPicOrderCntLsb = 0;

    const int PicOrderCntLsb = slice.pic_order_cnt_lsb;
    const int MaxPicOrderCntLsb = 1 << slice.getSPS()->log2_max_pic_order_cnt_lsb;
    int PicOrderCntMsb;

    if ((PicOrderCntLsb < prevPicOrderCntLsb) && ((prevPicOrderCntLsb - PicOrderCntLsb) >= (MaxPicOrderCntLsb / 2)))
        PicOrderCntMsb = prevPicOrderCntMsb + MaxPicOrderCntLsb;
    else if ((PicOrderCntLsb > prevPicOrderCntLsb) && ((PicOrderCntLsb - prevPicOrderCntLsb) > (MaxPicOrderCntLsb / 2)))
        PicOrderCntMsb = prevPicOrderCntMsb - MaxPicOrderCntLsb;
    else
        PicOrderCntMsb = prevPicOrderCntMsb;

    if (slice.memory_management_control_operation == 5)
    {
        prevPicOrderCntMsb = 0;
        if (!slice.bottom_field_flag)
            prevPicOrderCntLsb = PicOrderCntMsb + PicOrderCntLsb;
        else
            prevPicOrderCntLsb = 0;
    }
    else
    {
        prevPicOrderCntMsb = PicOrderCntMsb;
        prevPicOrderCntLsb = PicOrderCntLsb;
    }
    return (PicOrderCntMsb + PicOrderCntLsb) >> m_forceLsbDiv;
}